

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

ENetAcknowledgement *
enet_peer_queue_acknowledgement(ENetPeer *peer,ENetProtocol *command,enet_uint16 sentTime)

{
  ushort uVar1;
  _ENetListNode *p_Var2;
  ushort uVar3;
  ushort uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ENetListIterator result;
  ENetAcknowledgement *pEVar10;
  ushort uVar11;
  
  if ((ulong)(command->header).channelID < peer->channelCount) {
    uVar3 = (command->header).reliableSequenceNumber >> 0xc;
    uVar1 = *(ushort *)
             ((long)peer->channels->reliableWindows +
             (ulong)((uint)(command->header).channelID * 0x50) + 0x20);
    uVar4 = uVar1 >> 0xc;
    uVar11 = uVar3 + 0x10;
    if (uVar1 <= (command->header).reliableSequenceNumber) {
      uVar11 = uVar3;
    }
    if (uVar11 <= (ushort)(uVar4 + 8) && (ushort)(uVar4 + 7) <= uVar11) {
      return (ENetAcknowledgement *)0x0;
    }
  }
  pEVar10 = (ENetAcknowledgement *)(*callbacks.malloc)(0x48);
  if (pEVar10 != (ENetAcknowledgement *)0x0) {
    peer->outgoingDataTotal = peer->outgoingDataTotal + 8;
    pEVar10->sentTime = (uint)sentTime;
    uVar5 = *(undefined8 *)&(command->connect).mtu;
    uVar6 = *(undefined8 *)&(command->connect).channelCount;
    uVar7 = *(undefined8 *)&(command->connect).outgoingBandwidth;
    uVar8 = *(undefined8 *)&(command->connect).packetThrottleAcceleration;
    uVar9 = *(undefined8 *)&(command->connect).connectID;
    (pEVar10->command).acknowledge = command->acknowledge;
    *(undefined8 *)((long)&pEVar10->command + 8) = uVar5;
    *(undefined8 *)((long)&pEVar10->command + 0x10) = uVar6;
    *(undefined8 *)((long)&pEVar10->command + 0x18) = uVar7;
    *(undefined8 *)((long)&pEVar10->command + 0x20) = uVar8;
    *(undefined8 *)((long)&pEVar10->command + 0x28) = uVar9;
    p_Var2 = (peer->acknowledgements).sentinel.previous;
    (pEVar10->acknowledgementList).previous = p_Var2;
    (pEVar10->acknowledgementList).next = &(peer->acknowledgements).sentinel;
    p_Var2->next = (_ENetListNode *)pEVar10;
    (peer->acknowledgements).sentinel.previous = (_ENetListNode *)pEVar10;
    return pEVar10;
  }
  pEVar10 = (ENetAcknowledgement *)(*callbacks.no_memory)();
  return pEVar10;
}

Assistant:

ENetAcknowledgement *enet_peer_queue_acknowledgement(ENetPeer *peer, const ENetProtocol *command, enet_uint16 sentTime) {
        ENetAcknowledgement *acknowledgement;

        if (command->header.channelID < peer->channelCount) {
            ENetChannel *channel       = &peer->channels[command->header.channelID];
            enet_uint16 reliableWindow = command->header.reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
            enet_uint16 currentWindow  = channel->incomingReliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

            if (command->header.reliableSequenceNumber < channel->incomingReliableSequenceNumber) {
                reliableWindow += ENET_PEER_RELIABLE_WINDOWS;
            }

            if (reliableWindow >= currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS - 1 && reliableWindow <= currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS) {
                return NULL;
            }
        }

        acknowledgement = (ENetAcknowledgement *) enet_malloc(sizeof(ENetAcknowledgement));
        if (acknowledgement == NULL) {
            return NULL;
        }

        peer->outgoingDataTotal += sizeof(ENetProtocolAcknowledge);

        acknowledgement->sentTime = sentTime;
        acknowledgement->command  = *command;

        enet_list_insert(enet_list_end(&peer->acknowledgements), acknowledgement);
        return acknowledgement;
    }